

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavMoveRequestForward
               (ImGuiDir move_dir,ImGuiDir clip_dir,ImGuiNavMoveFlags move_flags,
               ImGuiScrollFlags scroll_flags)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  pIVar1->NavMoveScoringItems = false;
  pIVar1->NavMoveForwardToNextFrame = true;
  pIVar1->NavMoveSubmitted = false;
  pIVar1->NavAnyRequest = pIVar1->NavInitRequest;
  pIVar1->NavMoveDir = move_dir;
  pIVar1->NavMoveClipDir = clip_dir;
  pIVar1->NavMoveFlags = move_flags | 0x80;
  pIVar1->NavMoveScrollFlags = scroll_flags;
  return;
}

Assistant:

void ImGui::NavMoveRequestForward(ImGuiDir move_dir, ImGuiDir clip_dir, ImGuiNavMoveFlags move_flags, ImGuiScrollFlags scroll_flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavMoveForwardToNextFrame == false);
    NavMoveRequestCancel();
    g.NavMoveForwardToNextFrame = true;
    g.NavMoveDir = move_dir;
    g.NavMoveClipDir = clip_dir;
    g.NavMoveFlags = move_flags | ImGuiNavMoveFlags_Forwarded;
    g.NavMoveScrollFlags = scroll_flags;
}